

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_int(MIR_context_t ctx,writer_func_t writer,int64_t i)

{
  size_t *psVar1;
  uint uVar2;
  reduce_data *data;
  bool bVar3;
  size_t sVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint8_t uVar7;
  long lVar8;
  
  if (writer == (writer_func_t)0x0) {
    return 0;
  }
  lVar8 = 0;
  uVar6 = i;
  if (i != 0) {
    do {
      lVar8 = lVar8 + 1;
      bVar3 = 0xff < uVar6;
      uVar6 = uVar6 >> 8;
    } while (bVar3);
  }
  lVar8 = lVar8 + (ulong)(lVar8 == 0);
  uVar7 = (char)lVar8 + '\b';
  data = ctx->io_ctx->io_reduce_data;
  uVar2 = data->buf_bound;
  if ((ulong)uVar2 < 0x40000) {
    uVar5 = uVar2 + 1;
    data->buf[uVar2] = uVar7;
  }
  else {
    _reduce_encode_buf(data);
    uVar5 = 1;
    data->buf[0] = uVar7;
  }
  data->buf_bound = uVar5;
  sVar4 = put_uint(ctx,writer,i,(int)lVar8);
  psVar1 = &ctx->io_ctx->output_int_len;
  *psVar1 = *psVar1 + sVar4 + 1;
  return sVar4 + 1;
}

Assistant:

static size_t write_int (MIR_context_t ctx, writer_func_t writer, int64_t i) {
  size_t nb, len;

  if (writer == NULL) return 0;
  nb = int_length (i);
  assert (nb > 0);
  put_byte (ctx, writer, TAG_I1 + (int) nb - 1);
  len = put_int (ctx, writer, i, (int) nb) + 1;
  output_int_len += len;
  return len;
}